

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O0

void __thiscall
chrono::ChClassRegistration<myEmployeeCustomConstructor>::~ChClassRegistration
          (ChClassRegistration<myEmployeeCustomConstructor> *this)

{
  ChClassRegistration<myEmployeeCustomConstructor> *this_local;
  
  ~ChClassRegistration(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~ChClassRegistration() {

        // register in global class factory
        ChClassFactory::ClassUnregister(this->m_sTagName);
    }